

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectWrongNumTermsError(Parse *pParse,Select *p)

{
  char *pcVar1;
  Select *p_local;
  Parse *pParse_local;
  
  if ((p->selFlags & 0x200) == 0) {
    pcVar1 = selectOpName((uint)p->op);
    sqlite3ErrorMsg(pParse,
                    "SELECTs to the left and right of %s do not have the same number of result columns"
                    ,pcVar1);
  }
  else {
    sqlite3ErrorMsg(pParse,"all VALUES must have the same number of terms");
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectWrongNumTermsError(Parse *pParse, Select *p){
  if( p->selFlags & SF_Values ){
    sqlite3ErrorMsg(pParse, "all VALUES must have the same number of terms");
  }else{
    sqlite3ErrorMsg(pParse, "SELECTs to the left and right of %s"
      " do not have the same number of result columns", selectOpName(p->op));
  }
}